

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * duckdb::Exception::ConstructMessageRecursive<duckdb::SQLIdentifier>
                   (string *__return_storage_ptr__,string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,SQLIdentifier *param)

{
  string in_stack_ffffffffffffff88;
  undefined1 local_58 [56];
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffff88,(string *)param);
  duckdb::ExceptionFormatValue::CreateFormatValue<duckdb::SQLIdentifier>
            ((ExceptionFormatValue *)local_58,(SQLIdentifier)in_stack_ffffffffffffff88);
  std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>(values,(ExceptionFormatValue *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 0x18));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  duckdb::Exception::ConstructMessageRecursive((string *)__return_storage_ptr__,(vector *)msg);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}